

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

void __thiscall tinyusdz::ascii::AsciiParser::AsciiParser(AsciiParser *this,StreamReader *sr)

{
  _Rb_tree_header *p_Var1;
  
  this->_sr = sr;
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&this->_path_stack);
  (this->_curr_cursor).row = 0;
  (this->_curr_cursor).col = 0;
  p_Var1 = &(this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ::std::
  stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>>
  ::
  stack<std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>,void>
            (&this->err_stack);
  ::std::
  stack<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>>
  ::
  stack<std::deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>>,void>
            (&this->warn_stack);
  ::std::
  stack<tinyusdz::ascii::AsciiParser::ParseState,std::deque<tinyusdz::ascii::AsciiParser::ParseState,std::allocator<tinyusdz::ascii::AsciiParser::ParseState>>>
  ::
  stack<std::deque<tinyusdz::ascii::AsciiParser::ParseState,std::allocator<tinyusdz::ascii::AsciiParser::ParseState>>,void>
            (&this->parse_stack);
  this->_version = 1.0;
  this->_toplevel = true;
  this->_sub_layered = false;
  this->_referenced = false;
  this->_payloaded = false;
  (this->_option).allow_unknown_prim = true;
  (this->_option).allow_unknown_apiSchema = true;
  (this->_option).strict_allowedToken_check = false;
  (this->_base_dir)._M_dataplus._M_p = (pointer)&(this->_base_dir).field_2;
  (this->_base_dir)._M_string_length = 0;
  (this->_base_dir).field_2._M_local_buf[0] = '\0';
  StageMetas::StageMetas(&this->_stage_metas);
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->_prim_idx_assign_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_prim_idx_assign_fun).super__Function_base._M_functor + 8) = 0;
  (this->_prim_idx_assign_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_prim_idx_assign_fun)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_stage_meta_process_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_stage_meta_process_fun).super__Function_base._M_functor + 8) = 0;
  (this->_stage_meta_process_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_stage_meta_process_fun)._M_invoker = (_Invoker_type)0x0;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_primspec_mode = false;
  *(undefined8 *)&(this->_primspec_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_primspec_fun).super__Function_base._M_functor + 8) = 0;
  (this->_primspec_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_primspec_fun)._M_invoker = (_Invoker_type)0x0;
  Setup(this);
  return;
}

Assistant:

AsciiParser::AsciiParser(StreamReader *sr) : _sr(sr) { Setup(); }